

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

Value * __thiscall
cmFileAPI::BuildCMakeFiles(Value *__return_storage_ptr__,cmFileAPI *this,Object *object)

{
  Value *pVVar1;
  Value VStack_68;
  Value local_40;
  
  cmFileAPICMakeFilesDump(__return_storage_ptr__,this,object->Version);
  Json::Value::Value(&local_40,ObjectKindName::objectKindNames[(int)object->Kind]);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"kind");
  Json::Value::operator=(pVVar1,&local_40);
  Json::Value::~Value(&local_40);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"version");
  if (object->Version == 1) {
    BuildVersion(&VStack_68,1,0);
    Json::Value::operator=(pVVar1,&VStack_68);
    Json::Value::~Value(&VStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildCMakeFiles(Object const& object)
{
  using namespace std::placeholders;
  Json::Value cmakeFiles = cmFileAPICMakeFilesDump(*this, object.Version);
  cmakeFiles["kind"] = this->ObjectKindName(object.Kind);

  Json::Value& version = cmakeFiles["version"];
  if (object.Version == 1) {
    version = BuildVersion(1, CMakeFilesV1Minor);
  } else {
    return cmakeFiles; // should be unreachable
  }

  return cmakeFiles;
}